

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void save_load(lda *l,io_buf *model_file,bool read,bool text)

{
  _func_void_weight_ptr_void_ptr *p_Var1;
  bool bVar2;
  initial_weights *iw;
  ostream *poVar3;
  size_t sVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var5;
  size_t sVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  vw *all;
  float *data;
  uint32_t *puVar7;
  ulong uVar8;
  byte bVar9;
  uint64_t i;
  uint64_t index;
  uint32_t j;
  initial_weights init;
  ulong local_208;
  vw *local_200;
  uint local_1f8;
  uint local_1f4;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f0;
  ulong local_1e8;
  lda *local_1e0;
  ulong local_1d8;
  float *local_1d0;
  version_struct *local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1f8 = (uint)CONCAT71(in_register_00000009,text);
  all = l->all;
  local_1c0 = (ulong)all->num_bits;
  local_1e0 = l;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    local_1b8._0_4_ = all->initial_t;
    local_1b8._12_4_ = all->lda;
    local_1b8._4_4_ =
         ((local_1e0->lda_D / (float)(uint)local_1b8._12_4_) /
         (float)(ulong)(1L << ((byte)all->num_bits & 0x3f))) * 200.0;
    bVar2 = (all->weights).sparse;
    puVar7 = &(all->weights).dense_weights._stride_shift;
    if (bVar2 != false) {
      puVar7 = &(all->weights).sparse_weights._stride_shift;
    }
    local_1b8._16_4_ = 1 << ((byte)*puVar7 & 0x1f);
    local_1b8[8] = all->random_weights;
    if (bVar2 == true) {
      iw = calloc_or_throw<initial_weights>(1);
      iw->_stride = local_1b8._16_4_;
      iw->_initial = (weight)local_1b8._0_4_;
      iw->_initial_random = (weight)local_1b8._4_4_;
      iw->_random = (bool)(char)local_1b8._8_4_;
      *(int3 *)&iw->field_0x9 = SUB43(local_1b8._8_4_,1);
      iw->_lda = local_1b8._12_4_;
      (all->weights).sparse_weights.default_data = iw;
      (all->weights).sparse_weights.fun = set_initial_lda_wrapper<sparse_parameters>::func;
      set_initial_lda_wrapper<sparse_parameters>::func
                ((all->weights).sparse_weights.default_value,iw,0);
    }
    else {
      dense_parameters::set_default<initial_weights,set_initial_lda_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,(initial_weights *)local_1b8);
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_208 = 0;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    bVar9 = (byte)local_1f8 ^ 1;
    local_1c8 = &all->model_file_ver;
    local_1f0 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(all->weights).sparse_weights;
    local_1f4 = local_1f8 & 0xff;
    local_200 = all;
    do {
      while( true ) {
        uVar8 = (ulong)all->lda;
        if (bVar9 == 0 && !read) {
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        }
        if (read) {
          bVar2 = version_struct::operator>=(local_1c8,"8.0.3");
          if (bVar2) {
            sVar4 = io_buf::bin_read_fixed(model_file,(char *)&local_208,8,"");
          }
          else {
            sVar4 = io_buf::bin_read_fixed(model_file,(char *)&local_1d8,4,"");
            local_208 = local_1d8 & 0xffffffff;
          }
        }
        else {
          sVar4 = bin_text_write_fixed
                            (model_file,(char *)&local_208,8,(stringstream *)local_1b8,
                             SUB41(local_1f4,0));
        }
        if (sVar4 == 0) {
          sVar4 = 0;
        }
        else {
          if ((local_200->weights).sparse == true) {
            local_1e8 = local_208 <<
                        ((byte)(local_200->weights).sparse_weights._stride_shift & 0x3f) &
                        (local_200->weights).sparse_weights._weight_mask;
            _Var5._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_1f0,&local_1e8);
            if (_Var5._M_cur == (__node_type *)0x0) {
              local_1d0 = calloc_or_throw<float>
                                    (1L << ((byte)(local_200->weights).sparse_weights._stride_shift
                                           & 0x3f));
              local_1d8 = local_1e8;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)local_1f0,&local_1d8);
              _Var5._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find(local_1f0,&local_1e8);
              p_Var1 = (local_200->weights).sparse_weights.fun;
              if (p_Var1 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var1)(*(weight **)((long)_Var5._M_cur + 0x10),
                          (local_200->weights).sparse_weights.default_data);
              }
            }
            data = *(float **)
                    ((long)&((_Var5._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                            _M_storage._M_storage + 8);
          }
          else {
            data = (local_200->weights).dense_weights._begin +
                   (local_208 << ((byte)(local_200->weights).dense_weights._stride_shift & 0x3f) &
                   (local_200->weights).dense_weights._weight_mask);
          }
          for (; uVar8 != 0; uVar8 = uVar8 - 1) {
            if (bVar9 == 0 && !read) {
              poVar3 = std::ostream::_M_insert<double>((double)(*data + local_1e0->lda_rho));
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            }
            if (read) {
              sVar6 = io_buf::bin_read_fixed(model_file,(char *)data,4,"");
            }
            else {
              sVar6 = bin_text_write_fixed
                                (model_file,(char *)data,4,(stringstream *)local_1b8,
                                 SUB41(local_1f4,0));
            }
            sVar4 = sVar4 + sVar6;
            data = data + 1;
          }
        }
        all = local_200;
        if ((char)local_1f8 != '\0') {
          if (read) {
            sVar6 = 0;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\n",1)
            ;
            sVar6 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1b8,true);
          }
          sVar4 = sVar4 + sVar6;
        }
        if (!read) break;
        if (sVar4 == 0) goto LAB_001c7e4d;
      }
      local_208 = local_208 + 1;
    } while (local_208 >> ((byte)local_1c0 & 0x3f) == 0);
LAB_001c7e4d:
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void save_load(lda &l, io_buf &model_file, bool read, bool text)
{
  vw &all = *(l.all);
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    initial_weights init(all.initial_t, (float)(l.lda_D / all.lda / all.length() * 200), all.random_weights, all.lda,
        all.weights.stride());
    if (all.weights.sparse)
      all.weights.sparse_weights.set_default<initial_weights, set_initial_lda_wrapper<sparse_parameters>>(init);
    else
      all.weights.dense_weights.set_default<initial_weights, set_initial_lda_wrapper<dense_parameters>>(init);
  }
  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    stringstream msg;
    size_t brw = 1;

    do
    {
      brw = 0;
      size_t K = all.lda;
      if (!read && text)
        msg << i << " ";

      if (!read || all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
        brw += bin_text_read_write_fixed(model_file, (char *)&i, sizeof(i), "", read, msg, text);
      else
      {
        // support 32bit build models
        uint32_t j;
        brw += bin_text_read_write_fixed(model_file, (char *)&j, sizeof(j), "", read, msg, text);
        i = j;
      }

      if (brw != 0)
      {
        weight *w = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight *v = w + k;
          if (!read && text)
            msg << *v + l.lda_rho << " ";
          brw += bin_text_read_write_fixed(model_file, (char *)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        if (!read)
          msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }
      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}